

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffdelt(fitsfile *fptr,int *status)

{
  size_t sVar1;
  char *rowfilterx;
  int *in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  int *in_stack_00000018;
  int zerostatus;
  int tstatus;
  int slen;
  char *basename;
  int *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar2 = 0;
  if (in_RDI == (char *)0x0) {
    *in_RSI = 0x73;
    iVar3 = 0x73;
  }
  else if (*(int *)(*(long *)(in_RDI + 8) + 0x18) == 0x22b) {
    if (*in_RSI < 1) {
      ffchdu(_tstatus,in_stack_00000018);
    }
    else {
      ffchdu(_tstatus,in_stack_00000018);
    }
    ffflsh((fitsfile *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),iVar3,in_stack_ffffffffffffffc0);
    iVar3 = (*driverTable[*(int *)(*(long *)(in_RDI + 8) + 4)].close)(**(int **)(in_RDI + 8));
    if ((iVar3 != 0) && (*in_RSI < 1)) {
      *in_RSI = 0x6e;
      ffpmsg((char *)0x117b6d);
      ffpmsg((char *)0x117b7f);
    }
    if (driverTable[*(int *)(*(long *)(in_RDI + 8) + 4)].remove != (_func_int_char_ptr *)0x0) {
      sVar1 = strlen(*(char **)(*(long *)(in_RDI + 8) + 0x10));
      rowfilterx = (char *)malloc((long)((int)sVar1 + 1));
      if (rowfilterx == (char *)0x0) {
        *in_RSI = 0x71;
        return 0x71;
      }
      ffiurl(in_stack_00000008,unaff_retaddr,
             (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (char *)in_RSI,rowfilterx,(char *)_tstatus,basename,status);
      iVar3 = (*driverTable[*(int *)(*(long *)(in_RDI + 8) + 4)].remove)(rowfilterx);
      if (iVar3 != 0) {
        ffpmsg((char *)0x117c6e);
        ffpmsg((char *)0x117c80);
        if (*in_RSI == 0) {
          *in_RSI = 0x6e;
        }
      }
      free(rowfilterx);
    }
    fits_clear_Fptr(*(FITSfile **)(in_RDI + 8),in_RSI);
    free(*(void **)(*(long *)(in_RDI + 8) + 0x560));
    free(*(void **)(*(long *)(in_RDI + 8) + 0x68));
    free(*(void **)(*(long *)(in_RDI + 8) + 0x10));
    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x10) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 8) + 0x18) = 0;
    free(*(void **)(in_RDI + 8));
    free(in_RDI);
    iVar3 = *in_RSI;
  }
  else {
    *in_RSI = 0x72;
    iVar3 = 0x72;
  }
  return iVar3;
}

Assistant:

int ffdelt(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  close and DELETE the FITS file. 
*/
{
    char *basename;
    int slen, tstatus = NO_CLOSE_ERROR, zerostatus = 0;

    if (!fptr)
        return(*status = NULL_INPUT_PTR);
    else if ((fptr->Fptr)->validcode != VALIDSTRUC) /* check for magic value */
        return(*status = BAD_FILEPTR); 

    if (*status > 0)
       ffchdu(fptr, &tstatus);  /* turn off the error message from ffchdu */
    else
        ffchdu(fptr, status);  

    ffflsh(fptr, TRUE, status);     /* flush and disassociate IO buffers */

        /* call driver function to actually close the file */
    if ( (*driverTable[(fptr->Fptr)->driver].close)((fptr->Fptr)->filehandle) )
    {
        if (*status <= 0)
        {
            *status = FILE_NOT_CLOSED;  /* report error if no previous error */

            ffpmsg("failed to close the following file: (ffdelt)");
            ffpmsg((fptr->Fptr)->filename);
        }
    }

    /* call driver function to actually delete the file */
    if ( (driverTable[(fptr->Fptr)->driver].remove) )
    {
        /* parse the input URL to get the base filename */
        slen = strlen((fptr->Fptr)->filename);
        basename = (char *) malloc(slen +1);
        if (!basename)
            return(*status = MEMORY_ALLOCATION);
    
        fits_parse_input_url((fptr->Fptr)->filename, NULL, basename, NULL, NULL, NULL, NULL,
               NULL, &zerostatus);

       if ((*driverTable[(fptr->Fptr)->driver].remove)(basename))
        {
            ffpmsg("failed to delete the following file: (ffdelt)");
            ffpmsg((fptr->Fptr)->filename);
            if (!(*status))
                *status = FILE_NOT_CLOSED;
        }
        free(basename);
    }

    fits_clear_Fptr( fptr->Fptr, status);  /* clear Fptr address */
    free((fptr->Fptr)->iobuffer);    /* free memory for I/O buffers */
    free((fptr->Fptr)->headstart);    /* free memory for headstart array */
    free((fptr->Fptr)->filename);     /* free memory for the filename */
    (fptr->Fptr)->filename = 0;
    (fptr->Fptr)->validcode = 0;      /* magic value to indicate invalid fptr */
    free(fptr->Fptr);              /* free memory for the FITS file structure */
    free(fptr);                    /* free memory for the FITS file structure */

    return(*status);
}